

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationKeyFrames
          (OgreXmlSerializer *this,Animation *anim,VertexAnimationTrack *dest)

{
  string *__lhs;
  aiVector3t<float> axis;
  bool bVar1;
  string *__lhs_00;
  Logger *this_00;
  DeadlyImportError *this_01;
  aiVector3t<float> local_220;
  float local_214;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  TransformKeyFrameList *local_208;
  aiVector3t<float> local_200;
  TransformKeyFrame keyframe;
  char *local_1c8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  local_200.x = 0.0;
  local_200.y = 0.0;
  local_200.z = 0.0;
  NextNode_abi_cxx11_(this);
  __lhs = &this->m_currentNodeName;
  local_210 = &anim->name;
  local_208 = &dest->transformKeyFrames;
LAB_00463435:
  bVar1 = std::operator==(__lhs,"keyframe");
  if (!bVar1) {
    return;
  }
  TransformKeyFrame::TransformKeyFrame(&keyframe);
  keyframe.timePos = ReadAttribute<float>(this,"time");
LAB_0046346e:
  NextNode_abi_cxx11_(this);
  bVar1 = std::operator==(__lhs,"translate");
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,"rotate");
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"scale");
      if (!bVar1) goto LAB_004636c2;
    }
  }
  bVar1 = std::operator==(__lhs,"translate");
  if (bVar1) {
    keyframe.position.x = ReadAttribute<float>(this,"x");
    keyframe.position.y = ReadAttribute<float>(this,"y");
    keyframe.position.z = ReadAttribute<float>(this,"z");
  }
  else {
    bVar1 = std::operator==(__lhs,"rotate");
    if (bVar1) {
      local_214 = ReadAttribute<float>(this,"angle");
      __lhs_00 = NextNode_abi_cxx11_(this);
      bVar1 = std::operator!=(__lhs_00,"axis");
      if (bVar1) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,"No axis specified for keyframe rotation in animation ",local_210);
        DeadlyImportError::DeadlyImportError(this_01,local_1a8);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_220.x = 0.0;
      local_220.y = 0.0;
      local_220.z = 0.0;
      local_220.x = ReadAttribute<float>(this,"x");
      local_220.y = ReadAttribute<float>(this,"y");
      local_220.z = ReadAttribute<float>(this,"z");
      bVar1 = aiVector3t<float>::Equal(&local_220,&local_200,1e-06);
      if (bVar1) {
        local_220.x = 1.0;
        if ((local_214 != 0.0) || (NAN(local_214))) {
          this_00 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[67]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [67])
                     "Found invalid a key frame with a zero rotation axis in animation: ");
          std::operator<<((ostream *)local_1a8,(string *)local_210);
          std::__cxx11::stringbuf::str();
          Logger::warn(this_00,local_1c8[0]);
          std::__cxx11::string::~string((string *)local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        }
      }
      axis.y = local_220.y;
      axis.x = local_220.x;
      axis.z = local_220.z;
      aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_1a8,axis,local_214);
    }
    else {
      bVar1 = std::operator==(__lhs,"scale");
      if (bVar1) {
        keyframe.scale.x = ReadAttribute<float>(this,"x");
        keyframe.scale.y = ReadAttribute<float>(this,"y");
        keyframe.scale.z = ReadAttribute<float>(this,"z");
      }
    }
  }
  goto LAB_0046346e;
LAB_004636c2:
  std::vector<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>::
  push_back(local_208,&keyframe);
  goto LAB_00463435;
}

Assistant:

void OgreXmlSerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *dest)
{
    const aiVector3D zeroVec(0.f, 0.f, 0.f);

    NextNode();
    while(m_currentNodeName == nnKeyFrame)
    {
        TransformKeyFrame keyframe;
        keyframe.timePos = ReadAttribute<float>("time");

        NextNode();
        while(m_currentNodeName == nnTranslate || m_currentNodeName == nnRotate || m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnTranslate)
            {
                keyframe.position.x = ReadAttribute<float>(anX);
                keyframe.position.y = ReadAttribute<float>(anY);
                keyframe.position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotate)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError("No axis specified for keyframe rotation in animation " + anim->name);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);
                if (axis.Equal(zeroVec))
                {
                    axis.x = 1.0f;
                    if (angle != 0) {
                        ASSIMP_LOG_WARN_F("Found invalid a key frame with a zero rotation axis in animation: ", anim->name);
                    }
                }
                keyframe.rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                keyframe.scale.x = ReadAttribute<float>(anX);
                keyframe.scale.y = ReadAttribute<float>(anY);
                keyframe.scale.z = ReadAttribute<float>(anZ);
            }

            NextNode();
        }

        dest->transformKeyFrames.push_back(keyframe);
    }
}